

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O2

void invocation_message(void)

{
  boolean bVar1;
  int iVar2;
  obj *obj;
  char *pcVar3;
  char *pcVar4;
  char *__format;
  char buf [256];
  
  bVar1 = Invocation_lev(&u.uz);
  if (bVar1 == '\0') {
    return;
  }
  iVar2 = dist2((int)inv_pos.x,(int)inv_pos.y,(int)u.ux,(int)u.uy);
  pcVar3 = "faint trembling";
  if (iVar2 < 3) {
    pcVar3 = "weak trembling";
  }
  pcVar4 = "strange vibration";
  if (iVar2 != 0) {
    pcVar4 = pcVar3;
  }
  if (4 < iVar2) {
    return;
  }
  bVar1 = On_stairs(inv_pos.x,inv_pos.y);
  if (bVar1 != '\0') {
    return;
  }
  obj = carrying(0x10b);
  nomul(0,(char *)0x0);
  if (u.usteed == (monst *)0x0) {
    if ((((u.uprops[0x12].extrinsic == 0 && u.uprops[0x12].intrinsic == 0) &&
         ((youmonst.data)->mlet != '\x05')) && (u.uprops[0x3c].extrinsic == 0)) &&
       (((youmonst.data)->mflags1 & 1) == 0)) {
      pcVar3 = body_part(5);
      pcVar3 = makeplural(pcVar3);
      __format = "under your %s";
      goto LAB_001a33f9;
    }
    builtin_strncpy(buf,"beneath you",0xc);
  }
  else {
    pcVar3 = y_monnam(u.usteed);
    __format = "beneath %s";
LAB_001a33f9:
    sprintf(buf,__format,pcVar3);
  }
  pline("You feel a %s %s.",pcVar4,buf);
  bVar1 = invocation_pos(&u.uz,u.ux,u.uy);
  if (obj == (obj *)0x0 || bVar1 == '\0') {
    return;
  }
  if (obj->spe != '\a') {
    return;
  }
  if ((obj->field_0x4c & 8) == 0) {
    return;
  }
  pcVar3 = xname(obj);
  pcVar3 = The(pcVar3);
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
      if (((youmonst.data)->mflags1 & 0x1000) == 0) {
        pcVar4 = "glows with a strange light";
        goto LAB_001a3549;
      }
      goto LAB_001a34ac;
    }
  }
  else {
LAB_001a34ac:
    if (ublindf == (obj *)0x0) {
      pcVar4 = "throbs palpably";
      goto LAB_001a3549;
    }
  }
  pcVar4 = "throbs palpably";
  if (ublindf->oartifact == '\x1d') {
    pcVar4 = "glows with a strange light";
  }
LAB_001a3549:
  pline("%s %s!",pcVar3,pcVar4);
  return;
}

Assistant:

void invocation_message(void)
{
	/* a special clue-msg when near the Invocation position */
	if (Invocation_lev(&u.uz)) {
	    const char *strange_vibration;
	    int dist_invocation_pos = distu(inv_pos.x, inv_pos.y);

	    /* different message depending on the distance to the vibrating square
	       ..f..
	       .www.
	       fwswf
	       .www.
	       ..f..
	     */
	    if (dist_invocation_pos == 0)
		strange_vibration = "strange vibration";
	    else if (dist_invocation_pos <= 2)
		strange_vibration = "weak trembling";
	    else
		strange_vibration = "faint trembling";

	    /* within close proximity of the vibrating square */
	    if (dist_invocation_pos <= 4 && !On_stairs(inv_pos.x, inv_pos.y)) {
		char buf[BUFSZ];
		struct obj *otmp = carrying(CANDELABRUM_OF_INVOCATION);

		nomul(0, NULL);		/* stop running or travelling */

		if (u.usteed)
		    sprintf(buf, "beneath %s", y_monnam(u.usteed));
		else if (Levitation || Flying)
		    strcpy(buf, "beneath you");
		else
		    sprintf(buf, "under your %s", makeplural(body_part(FOOT)));
		pline("You feel a %s %s.", strange_vibration, buf);

		/* only report if on the vibrating square */
		if (invocation_pos(&u.uz, u.ux, u.uy) &&
		    otmp && otmp->spe == 7 && otmp->lamplit) {
		    pline("%s %s!", The(xname(otmp)),
			Blind ? "throbs palpably" : "glows with a strange light");
		}
	    }
	}
}